

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test::
~TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test *this)

{
  TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test *this_local;
  
  ~TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorNewArray)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = new char;
    CHECK(cpputestHasCrashed);
    delete memory;

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}